

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall icu_63::TextTrieMap::~TextTrieMap(TextTrieMap *this)

{
  UObjectDeleter *pUVar1;
  void *pvVar2;
  UVector *this_00;
  int32_t index;
  long lVar3;
  long lVar4;
  
  this->_vptr_TextTrieMap = (_func_int **)&PTR__TextTrieMap_0045f8f8;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < this->fNodesCount; lVar4 = lVar4 + 1) {
    CharacterNode::deleteValues
              ((CharacterNode *)((long)&this->fNodes->fValues + lVar3),this->fValueDeleter);
    lVar3 = lVar3 + 0x10;
  }
  uprv_free_63(this->fNodes);
  this_00 = this->fLazyContents;
  if (this_00 != (UVector *)0x0) {
    for (index = 1; index + -1 < this_00->count; index = index + 2) {
      pUVar1 = this->fValueDeleter;
      if (pUVar1 != (UObjectDeleter *)0x0) {
        pvVar2 = UVector::elementAt(this_00,index);
        (*pUVar1)(pvVar2);
        this_00 = this->fLazyContents;
      }
    }
    (*(this_00->super_UObject)._vptr_UObject[1])();
    return;
  }
  return;
}

Assistant:

TextTrieMap::~TextTrieMap() {
    int32_t index;
    for (index = 0; index < fNodesCount; ++index) {
        fNodes[index].deleteValues(fValueDeleter);
    }
    uprv_free(fNodes);
    if (fLazyContents != NULL) {
        for (int32_t i=0; i<fLazyContents->size(); i+=2) {
            if (fValueDeleter) {
                fValueDeleter(fLazyContents->elementAt(i+1));
            }
        } 
        delete fLazyContents;
    }
}